

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O3

void __thiscall
kj::_::
RunnableImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++:370:3)>
::run(RunnableImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_dynamic_test_c__:370:3)>
      *this)

{
  Builder *pBVar1;
  Schema SVar2;
  StringPtr name;
  Reader local_90;
  Reader local_58;
  
  pBVar1 = (this->func).root;
  SVar2.raw = (pBVar1->schema).super_Schema.raw;
  capnp::_::StructBuilder::asReader(&pBVar1->builder);
  name.content.size_ = 4;
  name.content.ptr = "foo";
  local_90.schema.super_Schema.raw = (Schema)(Schema)SVar2.raw;
  capnp::DynamicStruct::Reader::get(&local_58,&local_90,name);
  capnp::DynamicValue::Reader::~Reader(&local_58);
  return;
}

Assistant:

void run() override {
    func();
  }